

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> __thiscall
duckdb::TemporaryFileHandle::ReadTemporaryBuffer
          (TemporaryFileHandle *this,idx_t block_index,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
          *reusable_buffer)

{
  long lVar1;
  size_t srcSize;
  data_ptr_t dst;
  int iVar2;
  int iVar3;
  BufferManager *buffer_manager;
  type handle;
  undefined4 extraout_var;
  Allocator *this_00;
  pointer this_01;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pFVar4;
  long *in_RCX;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_50;
  AllocatedData compressed_buffer;
  
  buffer_manager = BufferManager::GetBufferManager(*(DatabaseInstance **)block_index);
  if (*(long *)(block_index + 8) == 0x40000) {
    handle = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                        *)(block_index + 0x40));
    lVar1 = *(long *)(block_index + 8);
    iVar2 = (*buffer_manager->_vptr_BufferManager[0xf])(buffer_manager);
    local_50._M_head_impl = (FileBuffer *)*in_RCX;
    *in_RCX = 0;
    StandardBufferManager::ReadTemporaryBufferInternal
              ((StandardBufferManager *)this,buffer_manager,handle,(long)reusable_buffer * lVar1,
               CONCAT44(extraout_var,iVar2),
               (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
               &local_50);
    if (local_50._M_head_impl != (FileBuffer *)0x0) {
      (*(local_50._M_head_impl)->_vptr_FileBuffer[1])();
    }
  }
  else {
    this_00 = Allocator::Get(*(DatabaseInstance **)block_index);
    Allocator::Allocate(&compressed_buffer,this_00,*(idx_t *)(block_index + 8));
    this_01 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
              operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                          *)(block_index + 0x40));
    FileHandle::Read(this_01,compressed_buffer.pointer,compressed_buffer.allocated_size,
                     (long)reusable_buffer * *(long *)(block_index + 8));
    iVar2 = (*buffer_manager->_vptr_BufferManager[0xf])(buffer_manager);
    iVar3 = (*buffer_manager->_vptr_BufferManager[0x10])(buffer_manager);
    (*buffer_manager->_vptr_BufferManager[0x1e])
              (this,buffer_manager,CONCAT44(extraout_var_00,iVar2),CONCAT44(extraout_var_01,iVar3));
    srcSize = *(size_t *)compressed_buffer.pointer;
    pFVar4 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>::
             operator->((unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                         *)this);
    dst = pFVar4->internal_buffer;
    pFVar4 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>::
             operator->((unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                         *)this);
    duckdb_zstd::ZSTD_decompress(dst,pFVar4->internal_size,compressed_buffer.pointer + 8,srcSize);
    AllocatedData::~AllocatedData(&compressed_buffer);
  }
  return (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)
         (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)this;
}

Assistant:

unique_ptr<FileBuffer> TemporaryFileHandle::ReadTemporaryBuffer(idx_t block_index,
                                                                unique_ptr<FileBuffer> reusable_buffer) const {
	auto &buffer_manager = BufferManager::GetBufferManager(db);
	if (identifier.size == TemporaryBufferSize::DEFAULT) {
		return StandardBufferManager::ReadTemporaryBufferInternal(
		    buffer_manager, *handle, GetPositionInFile(block_index), buffer_manager.GetBlockSize(),
		    std::move(reusable_buffer));
	}

	// Read compressed buffer
	auto compressed_buffer = Allocator::Get(db).Allocate(TemporaryBufferSizeToSize(identifier.size));
	handle->Read(compressed_buffer.get(), compressed_buffer.GetSize(), GetPositionInFile(block_index));

	// Decompress into buffer
	auto buffer = buffer_manager.ConstructManagedBuffer(
	    buffer_manager.GetBlockSize(), buffer_manager.GetTemporaryBlockHeaderSize(), std::move(reusable_buffer));

	const auto compressed_size = Load<idx_t>(compressed_buffer.get());
	D_ASSERT(!duckdb_zstd::ZSTD_isError(compressed_size));
	const auto decompressed_size = duckdb_zstd::ZSTD_decompress(
	    buffer->InternalBuffer(), buffer->AllocSize(), compressed_buffer.get() + sizeof(idx_t), compressed_size);
	(void)decompressed_size;
	D_ASSERT(!duckdb_zstd::ZSTD_isError(decompressed_size));

	D_ASSERT(decompressed_size == buffer->AllocSize());
	return buffer;
}